

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::native(SmallVectorImpl<char> *Path,Style style)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  Style SVar4;
  size_t sVar5;
  char *pcVar6;
  iterator PN;
  iterator PE;
  iterator PI;
  SmallString<128U> PathHome;
  Style style_local;
  SmallVectorImpl<char> *Path_local;
  
  PathHome.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._124_4_ =
       style;
  bVar3 = SmallVectorBase::empty((SmallVectorBase *)Path);
  if (!bVar3) {
    SVar4 = anon_unknown.dwarf_301f98::real_style
                      (PathHome.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                       InlineElts._124_4_);
    if (SVar4 == windows) {
      pcVar6 = (char *)(Path->super_SmallVectorTemplateBase<char,_true>).
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      pvVar1 = (Path->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      sVar5 = SmallVectorBase::size((SmallVectorBase *)Path);
      PathHome.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts[0x7b].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)(char  [1])0x2f;
      PathHome.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts[0x7a].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)(char  [1])0x5c;
      std::replace<char*,char>
                (pcVar6,(char *)((long)pvVar1 + sVar5),
                 (char *)(PathHome.super_SmallVector<char,_128U>.
                          super_SmallVectorStorage<char,_128U>.InlineElts + 0x7b),
                 (char *)(PathHome.super_SmallVector<char,_128U>.
                          super_SmallVectorStorage<char,_128U>.InlineElts + 0x7a));
      sVar5 = SmallVectorBase::size((SmallVectorBase *)Path);
      if (sVar5 == 0) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                     );
      }
      if (*(Path->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX == '~') {
        sVar5 = SmallVectorBase::size((SmallVectorBase *)Path);
        if (sVar5 != 1) {
          sVar5 = SmallVectorBase::size((SmallVectorBase *)Path);
          if (sVar5 < 2) {
            __assert_fail("idx < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                          ,0x9b,
                          "reference llvm::SmallVectorTemplateCommon<char>::operator[](size_type) [T = char]"
                         );
          }
          bVar3 = is_separator(*(char *)((long)(Path->super_SmallVectorTemplateBase<char,_true>).
                                               super_SmallVectorTemplateCommon<char,_void>.
                                               super_SmallVectorBase.BeginX + 1),
                               PathHome.super_SmallVector<char,_128U>.
                               super_SmallVectorStorage<char,_128U>.InlineElts._124_4_);
          if (!bVar3) {
            return;
          }
        }
        SmallString<128U>::SmallString((SmallString<128U> *)&PI);
        home_directory((SmallVectorImpl<char> *)&PI);
        pvVar1 = (Path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        pvVar2 = (Path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        sVar5 = SmallVectorBase::size((SmallVectorBase *)Path);
        SmallString<128u>::append<char*>
                  ((SmallString<128u> *)&PI,(char *)((long)pvVar1 + 1),
                   (char *)((long)pvVar2 + sVar5));
        SmallVectorImpl<char>::operator=(Path,(SmallVectorImpl<char> *)&PI);
        SmallString<128U>::~SmallString((SmallString<128U> *)&PI);
      }
    }
    else {
      PE = (iterator)
           (Path->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      pvVar1 = (Path->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      sVar5 = SmallVectorBase::size((SmallVectorBase *)Path);
      pcVar6 = (char *)((long)pvVar1 + sVar5);
      for (; PE < pcVar6; PE = PE + 1) {
        if (*PE == '\\') {
          if ((PE + 1 < pcVar6) && (PE[1] == '\\')) {
            PE = PE + 1;
          }
          else {
            *PE = '/';
          }
        }
      }
    }
  }
  return;
}

Assistant:

void native(SmallVectorImpl<char> &Path, Style style) {
  if (Path.empty())
    return;
  if (real_style(style) == Style::windows) {
    std::replace(Path.begin(), Path.end(), '/', '\\');
    if (Path[0] == '~' && (Path.size() == 1 || is_separator(Path[1], style))) {
      SmallString<128> PathHome;
      home_directory(PathHome);
      PathHome.append(Path.begin() + 1, Path.end());
      Path = PathHome;
    }
  } else {
    for (auto PI = Path.begin(), PE = Path.end(); PI < PE; ++PI) {
      if (*PI == '\\') {
        auto PN = PI + 1;
        if (PN < PE && *PN == '\\')
          ++PI; // increment once, the for loop will move over the escaped slash
        else
          *PI = '/';
      }
    }
  }
}